

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unredacted_debug_format_for_test.cc
# Opt level: O2

string * __thiscall
google::protobuf::util::UnredactedDebugFormatForTest_abi_cxx11_
          (string *__return_storage_ptr__,util *this,Message *message)

{
  Printer printer;
  Printer local_80;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  TextFormat::Printer::Printer(&local_80);
  local_80.expand_any_ = true;
  if ((int)local_80.report_sensitive_fields_ < 0xf) {
    local_80.report_sensitive_fields_ = kUnredactedDebugFormatForTest;
  }
  TextFormat::Printer::PrintToString(&local_80,(Message *)this,__return_storage_ptr__);
  TextFormat::Printer::~Printer(&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string UnredactedDebugFormatForTest(const google::protobuf::Message& message) {
  std::string debug_string;

  google::protobuf::TextFormat::Printer printer;
  printer.SetExpandAny(true);
  printer.SetReportSensitiveFields(
      internal::FieldReporterLevel::kUnredactedDebugFormatForTest);

  printer.PrintToString(message, &debug_string);

  return debug_string;
}